

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O3

void writeTiled(TiledOutputPart *out,
               vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *buf,
               vector<double,_std::allocator<double>_> *perf)

{
  int iVar1;
  iterator __position;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  double local_38;
  
  Imf_3_4::TiledOutputPart::header();
  lVar6 = Imf_3_4::Header::tileDescription();
  iVar1 = *(int *)(lVar6 + 8);
  lVar6 = std::chrono::_V2::steady_clock::now();
  iVar2 = Imf_3_4::TiledOutputPart::numXLevels();
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      iVar3 = Imf_3_4::TiledOutputPart::numYLevels();
      if (0 < iVar3) {
        iVar3 = 0;
        do {
          if (iVar2 == iVar3 || iVar1 == 2) {
            Imf_3_4::TiledOutputPart::setFrameBuffer((FrameBuffer *)out);
            iVar8 = (int)out;
            iVar4 = Imf_3_4::TiledOutputPart::numXTiles(iVar8);
            iVar5 = Imf_3_4::TiledOutputPart::numYTiles(iVar8);
            Imf_3_4::TiledOutputPart::writeTiles(iVar8,0,iVar4 + -1,0,iVar5 + -1,iVar2);
          }
          iVar3 = iVar3 + 1;
          iVar4 = Imf_3_4::TiledOutputPart::numYLevels();
        } while (iVar3 < iVar4);
      }
      iVar2 = iVar2 + 1;
      iVar3 = Imf_3_4::TiledOutputPart::numXLevels();
    } while (iVar2 < iVar3);
  }
  if (perf != (vector<double,_std::allocator<double>_> *)0x0) {
    lVar7 = std::chrono::_V2::steady_clock::now();
    local_38 = (double)(lVar7 - lVar6) / 1000000000.0;
    __position._M_current =
         (perf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
         ._M_finish;
    if (__position._M_current ==
        (perf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (perf,__position,&local_38);
    }
    else {
      *__position._M_current = local_38;
      (perf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void
writeTiled (
    TiledOutputPart& out, vector<FrameBuffer>& buf, vector<double>* perf)
{
    int levelIndex = 0;

    TileDescription          tiling = out.header ().tileDescription ();
    steady_clock::time_point start  = steady_clock::now ();

    for (int xLevel = 0; xLevel < out.numXLevels (); ++xLevel)
    {
        for (int yLevel = 0; yLevel < out.numYLevels (); ++yLevel)
        {
            if (tiling.mode == RIPMAP_LEVELS || xLevel == yLevel)
            {
                out.setFrameBuffer (buf[levelIndex]);
                out.writeTiles (
                    0,
                    out.numXTiles (xLevel) - 1,
                    0,
                    out.numYTiles (yLevel) - 1,
                    xLevel,
                    yLevel);
                ++levelIndex;
            }
        }
    }
    if (perf)
    {
        steady_clock::time_point end = steady_clock::now ();
        perf->push_back (timing (start, end));
    }
}